

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate
          (QHttpNetworkConnectionPrivate *this,quint16 connectionCount,QString *hostName,
          quint16 port,bool encrypt,bool isLocalSocket,ConnectionType type)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  undefined4 in_ECX;
  QObjectPrivate *pQVar7;
  QHttpNetworkConnectionChannel *pQVar8;
  undefined2 uVar9;
  QString *in_RDX;
  ProxyType in_ESI;
  QObjectPrivate *in_RDI;
  ulong uVar10;
  byte in_R8B;
  byte in_R9B;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000008;
  QString *in_stack_ffffffffffffff38;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff40;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff48;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff50;
  quint16 port_00;
  ProxyType type_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = (undefined2)in_ECX;
  type_00 = in_ESI;
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QHttpNetworkConnectionPrivate_0049de90;
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  QString::QString((QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined2 *)(in_RDI + 0x98) = uVar9;
  in_RDI[0x9a] = (QObjectPrivate)(in_R8B & 1);
  in_RDI[0x9b] = (QObjectPrivate)(in_R9B & 1);
  in_RDI[0x9c] = (QObjectPrivate)0x1;
  iVar3 = getPreferredActiveChannelCount(in_stack_00000008,in_ESI & 0xffff);
  *(int *)(in_RDI + 0xa0) = iVar3;
  *(ProxyType *)(in_RDI + 0xa4) = in_ESI & 0xffff;
  QTimer::QTimer((QTimer *)(in_RDI + 0xa8),(QObject *)0x0);
  pQVar7 = in_RDI + 0xb8;
  uVar4 = (ulong)*(int *)(in_RDI + 0xa4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(0x108),0);
  uVar10 = uVar5 + 8;
  if (SUB168(auVar2 * ZEXT816(0x108),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar10);
  port_00 = (quint16)((uint)in_ECX >> 0x10);
  *puVar6 = uVar4;
  pQVar8 = (QHttpNetworkConnectionChannel *)(puVar6 + 1);
  if (uVar4 != 0) {
    in_stack_ffffffffffffff48 = pQVar8 + uVar4;
    in_stack_ffffffffffffff50 = pQVar8;
    do {
      in_stack_ffffffffffffff40 = in_stack_ffffffffffffff50;
      QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel(in_stack_ffffffffffffff40);
      port_00 = (quint16)((uint)in_ECX >> 0x10);
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff40 + 1;
    } while (in_stack_ffffffffffffff50 != in_stack_ffffffffffffff48);
  }
  *(QHttpNetworkConnectionChannel **)pQVar7 = pQVar8;
  QString::QString((QString *)0x2e993b);
  QString::QString((QString *)0x2e9948);
  QString::QString((QString *)0x2e9952);
  QNetworkProxy::QNetworkProxy
            ((QNetworkProxy *)in_RDI,type_00,in_RDX,port_00,(QString *)in_stack_ffffffffffffff50,
             (QString *)in_stack_ffffffffffffff48);
  QString::~QString((QString *)0x2e9981);
  QString::~QString((QString *)0x2e998e);
  QString::~QString((QString *)0x2e999b);
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QList
            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2e99ac);
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QList
            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2e99bd);
  *(undefined4 *)(in_RDI + 0xf8) = 0;
  *(ConnectionType *)(in_RDI + 0xfc) = in_stack_00000008;
  std::shared_ptr<QSslContext>::shared_ptr((shared_ptr<QSslContext> *)0x2e99e5);
  QHttp2Configuration::QHttp2Configuration((QHttp2Configuration *)in_stack_ffffffffffffff40);
  QString::QString((QString *)0x2e9a07);
  QNetworkConnectionMonitor::QNetworkConnectionMonitor
            ((QNetworkConnectionMonitor *)in_stack_ffffffffffffff40);
  if ((QObjectPrivate)(in_R9B & 1) != (QObjectPrivate)0x0) {
    *(undefined4 *)(in_RDI + 0x7c) = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate(
        quint16 connectionCount, const QString &hostName, quint16 port, bool encrypt,
        bool isLocalSocket, QHttpNetworkConnection::ConnectionType type)
    : hostName(hostName),
      port(port),
      encrypt(encrypt),
      isLocalSocket(isLocalSocket),
      activeChannelCount(getPreferredActiveChannelCount(type, connectionCount)),
      channelCount(connectionCount),
      channels(new QHttpNetworkConnectionChannel[channelCount]),
#ifndef QT_NO_NETWORKPROXY
      networkProxy(QNetworkProxy::NoProxy),
#endif
      connectionType(type)
{
    if (isLocalSocket) // Don't try to do host lookup for local sockets
        networkLayerState = IPv4;
    // We allocate all 6 channels even if it's an HTTP/2-enabled
    // connection: in case the protocol negotiation via NPN/ALPN fails,
    // we will have normally working HTTP/1.1.
    Q_ASSERT(channelCount >= activeChannelCount);
}